

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O3

int PAL_vsprintf(char *buffer,char *format,__va_list_tag *argptr)

{
  int iVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = PAL__vsnprintf(buffer,0x7fffffff,format,argptr);
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar1;
    }
  }
  abort();
}

Assistant:

__attribute__((no_instrument_function))
int
__cdecl
PAL_vsprintf(char *buffer,
         const char *format,
         va_list argptr)
{
    LONG Length;

    PERF_ENTRY(vsprintf);
    ENTRY("PAL_vsprintf (buffer=%p, format=%p (%s), argptr=%p)\n",
          buffer, format, format, argptr);

    Length = PAL__vsnprintf(buffer, 0x7fffffff, format, argptr);

    LOGEXIT("PAL_vsprintf returns int %d\n", Length);
    PERF_EXIT(vsprintf);

    return Length;
}